

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::SignedConversionFunction::checkArguments
          (SignedConversionFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  Expression *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *in_RDI;
  ASTContext *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  bitmask<slang::ast::IntegralFlags> flags;
  Type *type;
  bitwidth_t in_stack_00000044;
  Compilation *comp;
  Type *pTVar2;
  Type *in_stack_ffffffffffffff88;
  bitmask<slang::ast::IntegralFlags> local_5c;
  underlying_type local_5b;
  underlying_type local_5a;
  bitmask<slang::ast::IntegralFlags> local_59;
  Type *local_58;
  Args *args_00;
  SystemSubroutine *in_stack_fffffffffffffff8;
  
  args_00 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x92a459);
  pTVar2 = (Type *)0x1;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_fffffffffffffff8,in_R8,SUB81((ulong)in_RCX >> 0x38,0),args_00,
                     in_stack_00000000,in_stack_00000020,in_stack_00000028);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    local_58 = not_null<const_slang::ast::Type_*>::operator*
                         ((not_null<const_slang::ast::Type_*> *)0x92a4d8);
    bVar1 = Type::isIntegral(pTVar2);
    if (bVar1) {
      local_5a = (underlying_type)Type::getIntegralFlags(in_stack_ffffffffffffff88);
      local_5b = (underlying_type)ast::operator~(TwoState);
      local_59 = bitmask<slang::ast::IntegralFlags>::operator&
                           ((bitmask<slang::ast::IntegralFlags> *)in_stack_ffffffffffffff88,
                            (bitmask<slang::ast::IntegralFlags> *)pTVar2);
      if ((in_RDI[3]._M_extent._M_extent_value & 1) != 0) {
        bitmask<slang::ast::IntegralFlags>::bitmask(&local_5c,Signed);
        bitmask<slang::ast::IntegralFlags>::operator|=(&local_59,&local_5c);
      }
      Type::getBitWidth((Type *)this_00);
      pTVar2 = Compilation::getType(comp,in_stack_00000044,param_5._7_1_);
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      pTVar2 = SystemSubroutine::badArg((SystemSubroutine *)this_00,in_R8,in_RCX);
    }
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        if (!type.isIntegral())
            return badArg(context, *args[0]);

        auto flags = type.getIntegralFlags() & ~IntegralFlags::Signed;
        if (toSigned)
            flags |= IntegralFlags::Signed;

        return comp.getType(type.getBitWidth(), flags);
    }